

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O2

void Expression_Term(KonohaContext *kctx,KonohaStack *sfp)

{
  int beginIdx;
  kNode *node;
  kException *tokenList;
  kint_t kVar1;
  kint_t kVar2;
  kToken *termToken;
  int iVar3;
  kNameSpace *ns;
  kSyntax *pkVar4;
  kTokenVar *token;
  KClass *foundClass;
  KClass *local_38;
  
  node = sfp[1].field_0.asNode;
  tokenList = sfp[3].field_0.asException;
  beginIdx = *(int *)&sfp[4].field_1;
  kVar1 = sfp[5].field_1.intValue;
  kVar2 = sfp[6].field_1.intValue;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"Expression_Term",200,"tracing..");
  iVar3 = (int)kVar1;
  if (beginIdx == iVar3) {
    ns = kNode_GetNameSpace(kctx,node);
    termToken = (kToken *)
                ((anon_union_8_14_74a59a6a_for_kArrayVar_2 *)&tokenList->uline)->unboxItems[iVar3];
    local_38 = (KClass *)0x0;
    iVar3 = ParseTypePattern(kctx,ns,(kArray *)tokenList,beginIdx,(int)kVar2,&local_38);
    if (local_38 == (KClass *)0x0) {
      iVar3 = beginIdx + 1;
    }
    else {
      termToken->field_6 = (anon_union_4_2_04a33953_for_kTokenVar_9)local_38->typeId;
      pkVar4 = (*kctx->klib->kNameSpace_GetSyntax)(kctx,ns,0xe0000006);
      termToken->resolvedSyntaxInfo = pkVar4;
    }
    kNode_Termnize(kctx,node,termToken);
    sfp[-4].field_1 = (anon_union_8_10_3f923e25_for_KonohaValueVar_2)(long)iVar3;
  }
  else {
    sfp[-4].field_1.unboxValue = 0xffffffffffffffff;
  }
  return;
}

Assistant:

static KMETHOD Expression_Term(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_Expression(node, tokenList, beginIdx, opIdx, endIdx);
	if(beginIdx == opIdx) {
		kNameSpace *ns = kNode_ns(node);
		kToken *tk = tokenList->TokenItems[opIdx];
		KClass *foundClass = NULL;
		int nextIdx = ParseTypePattern(kctx, ns, tokenList, beginIdx, endIdx, &foundClass);
		if(foundClass != NULL) {
			kToken_SetTypeId(kctx, tk, ns, foundClass->typeId);
		}
		else {
			nextIdx = opIdx + 1;
		}
		kNode_Termnize(kctx, node, tk);
		KReturnUnboxValue(nextIdx);
	}
	KReturnUnboxValue(-1);
}